

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_multi_file_info.cpp
# Opt level: O3

void duckdb::CSVMultiFileInfo::BindReader
               (ClientContext *context,vector<duckdb::LogicalType,_true> *return_types,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               *names,MultiFileBindData *bind_data)

{
  MultiFileOptions *file_options;
  CSVReaderOptions *pCVar1;
  case_insensitive_map_t<idx_t> *__ht;
  size_type sVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  ReadCSVData *result;
  type multi_file_list;
  pointer pMVar3;
  reference this_00;
  BaseUnionData *pBVar4;
  reference __k;
  iterator iVar5;
  reference pvVar6;
  reference pvVar7;
  BinderException *pBVar8;
  idx_t i;
  size_type __n;
  size_type __n_00;
  __alloc_node_gen_t __alloc_node_gen;
  CSVError exception;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  result = (ReadCSVData *)
           unique_ptr<duckdb::TableFunctionData,_std::default_delete<duckdb::TableFunctionData>,_true>
           ::operator->(&bind_data->bind_data);
  multi_file_list = shared_ptr<duckdb::MultiFileList,_true>::operator*(&bind_data->file_list);
  pCVar1 = &(result->super_BaseCSVData).options;
  file_options = &bind_data->file_options;
  if ((bind_data->file_options).union_by_name == false) {
    if ((result->super_BaseCSVData).options.auto_detect == true) {
      SchemaDiscovery(context,result,pCVar1,file_options,return_types,names,multi_file_list);
    }
    else {
      if ((result->super_BaseCSVData).options.columns_set == false) {
        pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
        exception.error_message._M_dataplus._M_p = (pointer)&exception.error_message.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&exception,
                   "read_csv requires columns to be specified through the \'columns\' option. Use read_csv_auto or set read_csv(..., AUTO_DETECT=TRUE) to automatically guess columns."
                   ,"");
        BinderException::BinderException(pBVar8,&exception.error_message);
        __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)names,&(result->super_BaseCSVData).options.name_list.
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 );
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)return_types,
                 &(result->super_BaseCSVData).options.sql_type_list.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
    }
    (result->super_BaseCSVData).options.dialect_options.num_cols =
         (long)(names->
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(names->
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 5;
    pMVar3 = unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
             ::operator->(&bind_data->multi_file_reader);
    (*pMVar3->_vptr_MultiFileReader[8])
              (pMVar3,file_options,multi_file_list,return_types,names,&bind_data->reader_bind);
    return;
  }
  pMVar3 = unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>::
           operator->(&bind_data->multi_file_reader);
  MultiFileReader::BindUnionReader<duckdb::CSVMultiFileInfo,duckdb::CSVReaderOptions>
            ((MultiFileReaderBindData *)&exception,pMVar3,context,return_types,names,multi_file_list
             ,bind_data,pCVar1,file_options);
  (bind_data->reader_bind).filename_idx.index = (idx_t)exception.error_message._M_dataplus._M_p;
  (bind_data->reader_bind).hive_partitioning_indexes.
  super_vector<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>.
  super__Vector_base<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)exception.error_message.field_2._8_8_
  ;
  __alloc_node_gen._M_h =
       (__hashtable_alloc *)
       (bind_data->reader_bind).hive_partitioning_indexes.
       super_vector<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>.
       super__Vector_base<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (bind_data->reader_bind).hive_partitioning_indexes.
  super_vector<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>.
  super__Vector_base<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)exception.error_message._M_string_length;
  (bind_data->reader_bind).hive_partitioning_indexes.
  super_vector<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>.
  super__Vector_base<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pointer)exception.error_message.field_2._M_allocated_capacity;
  exception.error_message._M_string_length = 0;
  exception.error_message.field_2._M_allocated_capacity = 0;
  exception.error_message.field_2._8_8_ = 0;
  ::std::vector<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>::
  ~vector((vector<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_> *)
          &__alloc_node_gen);
  (bind_data->reader_bind).schema.
  super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
  .
  super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)exception.full_error_message.field_2._M_allocated_capacity;
  __alloc_node_gen._M_h =
       (__hashtable_alloc *)
       (bind_data->reader_bind).schema.
       super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
       .
       super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (bind_data->reader_bind).schema.
  super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
  .
  super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)exception.full_error_message._M_dataplus._M_p
  ;
  (bind_data->reader_bind).schema.
  super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
  .
  super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)exception.full_error_message._M_string_length;
  exception.full_error_message._M_dataplus._M_p = (pointer)0x0;
  exception.full_error_message._M_string_length = 0;
  exception.full_error_message.field_2._M_allocated_capacity = 0;
  ::std::
  vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>::
  ~vector((vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
           *)&__alloc_node_gen);
  (bind_data->reader_bind).mapping = exception.full_error_message.field_2._M_local_buf[8];
  ::std::
  vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>::
  ~vector((vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
           *)&exception.full_error_message);
  ::std::vector<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>::
  ~vector((vector<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_> *)
          &exception.error_message._M_string_length);
  if (0x10 < (ulong)((long)(bind_data->union_readers).
                           super_vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
                           .
                           super__Vector_base<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(bind_data->union_readers).
                          super_vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
                          .
                          super__Vector_base<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    __n = 0;
    do {
      this_00 = vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_true>::operator[]
                          (&bind_data->union_readers,__n);
      pBVar4 = shared_ptr<duckdb::BaseUnionData,_true>::operator->(this_00);
      ::std::vector<duckdb::ColumnInfo,std::allocator<duckdb::ColumnInfo>>::
      emplace_back<duckdb::vector<std::__cxx11::string,true>&,duckdb::vector<duckdb::LogicalType,true>&>
                ((vector<duckdb::ColumnInfo,std::allocator<duckdb::ColumnInfo>> *)
                 &result->column_info,&pBVar4->names,&pBVar4->types);
      __n = __n + 1;
    } while (__n < (ulong)((long)(bind_data->union_readers).
                                 super_vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(bind_data->union_readers).
                                 super_vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  sVar2 = (result->super_BaseCSVData).options.sql_types_per_column._M_h._M_element_count;
  if (sVar2 != 0) {
    __ht = &(result->super_BaseCSVData).options.sql_types_per_column;
    local_68._M_buckets = (__buckets_ptr)0x0;
    local_68._M_bucket_count =
         (result->super_BaseCSVData).options.sql_types_per_column._M_h._M_bucket_count;
    local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    pCVar1 = &(result->super_BaseCSVData).options;
    local_68._M_rehash_policy._M_max_load_factor =
         (pCVar1->sql_types_per_column)._M_h._M_rehash_policy._M_max_load_factor;
    local_68._M_rehash_policy._4_4_ =
         *(undefined4 *)&(pCVar1->sql_types_per_column)._M_h._M_rehash_policy.field_0x4;
    local_68._M_rehash_policy._M_next_resize =
         (result->super_BaseCSVData).options.sql_types_per_column._M_h._M_rehash_policy.
         _M_next_resize;
    local_68._M_single_bucket = (__node_base_ptr)0x0;
    __alloc_node_gen._M_h = (__hashtable_alloc *)&local_68;
    local_68._M_element_count = sVar2;
    ::std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,unsigned_long>,true>>>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&local_68,&__ht->_M_h,&__alloc_node_gen);
    CSVError::ColumnTypesError(&exception,(case_insensitive_map_t<idx_t> *)&local_68,names);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_68);
    if (exception.error_message._M_string_length != 0) {
      pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
      BinderException::BinderException(pBVar8,&exception.error_message);
      __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((names->
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (names->
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      __n_00 = 0;
      do {
        __k = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ::operator[](names,__n_00);
        iVar5 = ::std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&__ht->_M_h,__k);
        if (iVar5.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
            ._M_cur != (__node_type *)0x0) {
          pvVar6 = vector<duckdb::LogicalType,_true>::operator[]
                             (&(result->super_BaseCSVData).options.sql_type_list,
                              *(size_type *)
                               ((long)iVar5.
                                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                      ._M_cur + 0x28));
          pvVar7 = vector<duckdb::LogicalType,_true>::operator[](return_types,__n_00);
          if (pvVar7 != pvVar6) {
            pvVar7->id_ = pvVar6->id_;
            pvVar7->physical_type_ = pvVar6->physical_type_;
            shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                      (&pvVar7->type_info_,&pvVar6->type_info_);
          }
        }
        __n_00 = __n_00 + 1;
      } while (__n_00 < (ulong)((long)(names->
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(names->
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)exception.csv_row._M_dataplus._M_p != &exception.csv_row.field_2) {
      operator_delete(exception.csv_row._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)exception.full_error_message._M_dataplus._M_p != &exception.full_error_message.field_2) {
      operator_delete(exception.full_error_message._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)exception.error_message._M_dataplus._M_p != &exception.error_message.field_2) {
      operator_delete(exception.error_message._M_dataplus._M_p);
    }
  }
  this = (bind_data->initial_reader).internal.
         super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (bind_data->initial_reader).internal.
  super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (bind_data->initial_reader).internal.
  super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  return;
}

Assistant:

void CSVMultiFileInfo::BindReader(ClientContext &context, vector<LogicalType> &return_types, vector<string> &names,
                                  MultiFileBindData &bind_data) {
	auto &csv_data = bind_data.bind_data->Cast<ReadCSVData>();
	auto &multi_file_list = *bind_data.file_list;
	auto &options = csv_data.options;
	if (!bind_data.file_options.union_by_name) {
		if (options.auto_detect) {
			SchemaDiscovery(context, csv_data, options, bind_data.file_options, return_types, names, multi_file_list);
		} else {
			// If we are not running the sniffer, the columns must be set!
			if (!options.columns_set) {
				throw BinderException("read_csv requires columns to be specified through the 'columns' option. Use "
				                      "read_csv_auto or set read_csv(..., "
				                      "AUTO_DETECT=TRUE) to automatically guess columns.");
			}
			names = options.name_list;
			return_types = options.sql_type_list;
		}
		D_ASSERT(return_types.size() == names.size());
		csv_data.options.dialect_options.num_cols = names.size();

		bind_data.multi_file_reader->BindOptions(bind_data.file_options, multi_file_list, return_types, names,
		                                         bind_data.reader_bind);
	} else {
		bind_data.reader_bind = bind_data.multi_file_reader->BindUnionReader<CSVMultiFileInfo>(
		    context, return_types, names, multi_file_list, bind_data, options, bind_data.file_options);
		if (bind_data.union_readers.size() > 1) {
			for (idx_t i = 0; i < bind_data.union_readers.size(); i++) {
				auto &csv_union_data = bind_data.union_readers[i]->Cast<CSVUnionData>();
				csv_data.column_info.emplace_back(csv_union_data.names, csv_union_data.types);
			}
		}
		if (!options.sql_types_per_column.empty()) {
			const auto exception = CSVError::ColumnTypesError(options.sql_types_per_column, names);
			if (!exception.error_message.empty()) {
				throw BinderException(exception.error_message);
			}
			for (idx_t i = 0; i < names.size(); i++) {
				auto it = options.sql_types_per_column.find(names[i]);
				if (it != options.sql_types_per_column.end()) {
					return_types[i] = options.sql_type_list[it->second];
				}
			}
		}
		bind_data.initial_reader.reset();
	}
}